

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_guardedTests.cpp
# Opt level: O2

void __thiscall
MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
::deallocate(MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
             *this,zombie_list_node *memory,size_t size)

{
  event local_20;
  
  if (memory != (zombie_list_node *)0x0) {
    operator_delete(memory,size * 0x18);
    local_20.allocated = false;
    local_20.size = size * 0x18;
    std::vector<event,_std::allocator<event>_>::emplace_back<event>(this->log,&local_20);
  }
  return;
}

Assistant:

void deallocate(T* memory, size_t size)
    {
        if (memory) {
            std::allocator<T>{}.deallocate(memory, size);
            log->emplace_back(event{size * sizeof(T), false});
        }
    }